

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O1

ps_latlink_t * ps_lattice_traverse_edges(ps_lattice_t *dag,ps_latnode_t *start,ps_latnode_t *end)

{
  anon_union_8_4_397b8dde_for_info *paVar1;
  ps_latlink_t *ppVar2;
  ps_latnode_t *ppVar3;
  latlink_list_t *plVar4;
  
  do {
    ppVar2 = ps_lattice_popq(dag);
  } while (ppVar2 != (ps_latlink_t *)0x0);
  for (ppVar3 = dag->nodes; ppVar3 != (ps_latnode_t *)0x0; ppVar3 = ppVar3->next) {
    (ppVar3->info).fanin = 0;
  }
  for (ppVar3 = dag->nodes; ppVar3 != (ps_latnode_t *)0x0; ppVar3 = ppVar3->next) {
    for (plVar4 = ppVar3->exits; plVar4 != (latlink_list_t *)0x0; plVar4 = plVar4->next) {
      paVar1 = &plVar4->link->to->info;
      paVar1->fanin = paVar1->fanin + 1;
    }
  }
  if (start == (ps_latnode_t *)0x0) {
    start = dag->start;
  }
  for (plVar4 = start->exits; plVar4 != (latlink_list_t *)0x0; plVar4 = plVar4->next) {
    ps_lattice_pushq(dag,plVar4->link);
  }
  ppVar2 = ps_lattice_traverse_next(dag,end);
  return ppVar2;
}

Assistant:

ps_latlink_t *
ps_lattice_traverse_edges(ps_lattice_t *dag, ps_latnode_t *start, ps_latnode_t *end)
{
    ps_latnode_t *node;
    latlink_list_t *x;

    /* Cancel any unfinished traversal. */
    ps_lattice_delq(dag);

    /* Initialize node fanin counts and path scores. */
    for (node = dag->nodes; node; node = node->next)
        node->info.fanin = 0;
    for (node = dag->nodes; node; node = node->next) {
        for (x = node->exits; x; x = x->next)
            (x->link->to->info.fanin)++;
    }

    /* Initialize agenda with all exits from start. */
    if (start == NULL) start = dag->start;
    for (x = start->exits; x; x = x->next)
        ps_lattice_pushq(dag, x->link);

    /* Pull the first edge off the queue. */
    return ps_lattice_traverse_next(dag, end);
}